

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::cut(QLineEdit *this)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RSI;
  QLineEdit *in_RDI;
  
  bVar1 = hasSelectedText(in_RDI);
  if (bVar1) {
    copy(in_RDI,in_RSI,src);
    del(in_RDI);
  }
  return;
}

Assistant:

void QLineEdit::cut()
{
    if (hasSelectedText()) {
        copy();
        del();
    }
}